

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Xor_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  undefined4 local_38;
  undefined4 local_34;
  int32 nRight;
  int32 nLeft;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  bVar1 = TaggedInt::Is(aLeft);
  if (bVar1) {
    local_34 = TaggedInt::ToInt32(aLeft);
  }
  else {
    local_34 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  }
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    local_38 = TaggedInt::ToInt32(aRight);
  }
  else {
    local_38 = JavascriptConversion::ToInt32(aRight,scriptContext);
  }
  pvVar2 = JavascriptNumber::ToVarInPlace(local_34 ^ local_38,scriptContext,result);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Xor_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext,  JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_XorInPlace);
            int32 nLeft = TaggedInt::Is(aLeft) ? TaggedInt::ToInt32(aLeft) : JavascriptConversion::ToInt32(aLeft, scriptContext);
            int32 nRight = TaggedInt::Is(aRight) ? TaggedInt::ToInt32(aRight) : JavascriptConversion::ToInt32(aRight, scriptContext);

            return JavascriptNumber::ToVarInPlace(nLeft ^ nRight, scriptContext, result);
            JIT_HELPER_END(Op_XorInPlace);
        }